

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O3

bool __thiscall QStackedLayout::hasHeightForWidth(QStackedLayout *this)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  int iVar4;
  bool bVar5;
  
  iVar2 = (**(code **)(*(long *)&this->super_QLayout + 200))();
  iVar4 = 0;
  if (iVar2 < 1) {
    bVar5 = false;
  }
  else {
    bVar5 = true;
    do {
      plVar3 = (long *)(**(code **)(*(long *)&this->super_QLayout + 0xa8))(this,iVar4);
      if ((plVar3 != (long *)0x0) && (cVar1 = (**(code **)(*plVar3 + 0x48))(plVar3), cVar1 != '\0'))
      {
        return bVar5;
      }
      iVar4 = iVar4 + 1;
      bVar5 = iVar4 < iVar2;
    } while (iVar4 != iVar2);
  }
  return bVar5;
}

Assistant:

bool QStackedLayout::hasHeightForWidth() const
{
    const int n = count();

    for (int i = 0; i < n; ++i) {
        if (QLayoutItem *item = itemAt(i)) {
            if (item->hasHeightForWidth())
                return true;
        }
    }
    return false;
}